

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmatrix.c
# Opt level: O1

void Q_SetKer(QMatrix *Q,Vector *RightKer,Vector *LeftKer)

{
  ulong uVar1;
  Real *pRVar2;
  LASErrIdType LVar3;
  ulong uVar4;
  Real *pRVar5;
  double dVar6;
  undefined1 auVar7 [16];
  double dVar8;
  
  V_Lock(RightKer);
  V_Lock(LeftKer);
  LVar3 = LASResult();
  if (LVar3 != LASOK) goto LAB_0010f31a;
  uVar1 = Q->Dim;
  LVar3 = LASDimErr;
  if ((uVar1 == RightKer->Dim) && ((Q->Symmetry != False || (uVar1 == LeftKer->Dim)))) {
    if (Q->RightKerCmp != (Real *)0x0) {
      free(Q->RightKerCmp);
      Q->RightKerCmp = (Real *)0x0;
    }
    if (Q->LeftKerCmp != (Real *)0x0) {
      free(Q->LeftKerCmp);
      Q->LeftKerCmp = (Real *)0x0;
    }
    Q->UnitRightKer = False;
    Q->UnitLeftKer = False;
    pRVar2 = RightKer->Cmp;
    dVar6 = 0.0;
    if (uVar1 != 0) {
      uVar4 = 1;
      do {
        dVar6 = dVar6 + pRVar2[uVar4];
        uVar4 = uVar4 + 1;
      } while (uVar4 <= uVar1);
    }
    auVar7._8_4_ = (int)(uVar1 >> 0x20);
    auVar7._0_8_ = uVar1;
    auVar7._12_4_ = 0x45300000;
    dVar8 = (auVar7._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
    dVar6 = dVar6 / dVar8;
    Q->UnitRightKer = True;
    if (2.2250738585072014e-307 <= ABS(dVar6)) {
      if (uVar1 != 0) {
        uVar4 = 1;
        do {
          if (2.220446049250313e-15 <= ABS(pRVar2[uVar4] / dVar6 + -1.0)) {
            Q->UnitRightKer = False;
          }
          uVar4 = uVar4 + 1;
        } while (uVar4 <= uVar1);
      }
    }
    else {
      Q->UnitRightKer = False;
    }
    if (Q->UnitRightKer == False) {
      dVar6 = 0.0;
      if (uVar1 != 0) {
        uVar4 = 1;
        do {
          dVar6 = dVar6 + pRVar2[uVar4] * pRVar2[uVar4];
          uVar4 = uVar4 + 1;
        } while (uVar4 <= uVar1);
      }
      if (dVar6 < 0.0) {
        dVar6 = sqrt(dVar6);
      }
      else {
        dVar6 = SQRT(dVar6);
      }
      if (2.2250738585072014e-307 <= ABS(dVar6)) {
        pRVar5 = (Real *)malloc(uVar1 * 8 + 8);
        Q->RightKerCmp = pRVar5;
        if (pRVar5 == (Real *)0x0) {
          LASError(LASMemAllocErr,"Q_SetKer",Q->Name,RightKer->Name,LeftKer->Name);
        }
        else if (uVar1 != 0) {
          uVar4 = 1;
          do {
            pRVar5[uVar4] = pRVar2[uVar4] / dVar6;
            uVar4 = uVar4 + 1;
          } while (uVar4 <= uVar1);
        }
      }
    }
    if (Q->Symmetry != False) goto LAB_0010f31a;
    pRVar2 = LeftKer->Cmp;
    dVar6 = 0.0;
    if (uVar1 != 0) {
      uVar4 = 1;
      do {
        dVar6 = dVar6 + pRVar2[uVar4];
        uVar4 = uVar4 + 1;
      } while (uVar4 <= uVar1);
    }
    dVar6 = dVar6 / dVar8;
    Q->UnitLeftKer = True;
    if (2.2250738585072014e-307 <= ABS(dVar6)) {
      if (uVar1 != 0) {
        uVar4 = 1;
        do {
          if (2.220446049250313e-15 <= ABS(pRVar2[uVar4] / dVar6 + -1.0)) {
            Q->UnitLeftKer = False;
          }
          uVar4 = uVar4 + 1;
        } while (uVar4 <= uVar1);
      }
    }
    else {
      Q->UnitLeftKer = False;
    }
    if (Q->UnitLeftKer != False) goto LAB_0010f31a;
    dVar6 = 0.0;
    if (uVar1 != 0) {
      uVar4 = 1;
      do {
        dVar6 = dVar6 + pRVar2[uVar4] * pRVar2[uVar4];
        uVar4 = uVar4 + 1;
      } while (uVar4 <= uVar1);
    }
    if (dVar6 < 0.0) {
      dVar6 = sqrt(dVar6);
    }
    else {
      dVar6 = SQRT(dVar6);
    }
    if (ABS(dVar6) < 2.2250738585072014e-307) goto LAB_0010f31a;
    pRVar5 = (Real *)malloc(uVar1 * 8 + 8);
    Q->LeftKerCmp = pRVar5;
    if (pRVar5 != (Real *)0x0) {
      if (uVar1 != 0) {
        uVar4 = 1;
        do {
          pRVar5[uVar4] = pRVar2[uVar4] / dVar6;
          uVar4 = uVar4 + 1;
        } while (uVar4 <= uVar1);
      }
      goto LAB_0010f31a;
    }
    LVar3 = LASMemAllocErr;
  }
  LASError(LVar3,"Q_SetKer",Q->Name,RightKer->Name,LeftKer->Name);
LAB_0010f31a:
  V_Unlock(RightKer);
  V_Unlock(LeftKer);
  return;
}

Assistant:

void Q_SetKer(QMatrix *Q, Vector *RightKer, Vector *LeftKer)
/* defines the null space in the case of a singular matrix */
{
    double Sum, Mean, Cmp, Norm;
    size_t Dim, Ind;
    Real *KerCmp;

    V_Lock(RightKer);
    V_Lock(LeftKer);
    
    if (LASResult() == LASOK) {
	if (Q->Dim == RightKer->Dim && (Q->Symmetry || Q->Dim == LeftKer->Dim)) {
  	    Dim = Q->Dim;
	    
	    /* release array for old null space components when it exists */ 
	    if (Q->RightKerCmp != NULL) {
	        free(Q->RightKerCmp);
	        Q->RightKerCmp = NULL;
	    }
	    if (Q->LeftKerCmp != NULL) {
	        free(Q->LeftKerCmp);
	        Q->LeftKerCmp = NULL;
	    }
	    Q->UnitRightKer = False;
	    Q->UnitLeftKer = False;
	    
	    /* right null space */
            KerCmp = RightKer->Cmp;
	    /* test whether the matrix Q has a unit right null space */
	    Sum = 0.0;
	    for(Ind = 1; Ind <= Dim; Ind++)
	        Sum += KerCmp[Ind];
	    Mean = Sum / (double)Dim;
	    Q->UnitRightKer = True;
	    if (!IsZero(Mean)) {
	        for(Ind = 1; Ind <= Dim; Ind++)
                    if (!IsOne(KerCmp[Ind] / Mean))
		        Q->UnitRightKer = False;
            } else {
	        Q->UnitRightKer = False;
	    }
	    if (!Q->UnitRightKer) {
	        Sum = 0.0;
	        for(Ind = 1; Ind <= Dim; Ind++) {
	            Cmp = KerCmp[Ind];
	            Sum += Cmp * Cmp;
	        }
		Norm = sqrt(Sum);
		if (!IsZero(Norm)) {
                    Q->RightKerCmp = (Real *)malloc((Dim + 1) * sizeof(Real));
		    if (Q->RightKerCmp != NULL) {
		        for(Ind = 1; Ind <= Dim; Ind++)
	                    Q->RightKerCmp[Ind] = KerCmp[Ind] / Norm;
		    } else {
	                LASError(LASMemAllocErr, "Q_SetKer", Q->Name, RightKer->Name,
		            LeftKer->Name);
		    }
		}
	    }
	    
	    if (!Q->Symmetry) {
	        /* left null space */
                KerCmp = LeftKer->Cmp;
	        /* test whether the matrix Q has a unit left null space */
	        Sum = 0.0;
	        for(Ind = 1; Ind <= Dim; Ind++)
	            Sum += KerCmp[Ind];
	        Mean = Sum / (double)Dim;
	        Q->UnitLeftKer = True;
	        if (!IsZero(Mean)) {
	            for(Ind = 1; Ind <= Dim; Ind++)
                        if (!IsOne(KerCmp[Ind] / Mean))
		            Q->UnitLeftKer = False;
                } else {
	            Q->UnitLeftKer = False;
	        }
	        if (!Q->UnitLeftKer) {
	            Sum = 0.0;
	            for(Ind = 1; Ind <= Dim; Ind++) {
	                Cmp = KerCmp[Ind];
	                Sum += Cmp * Cmp;
	            }
		    Norm = sqrt(Sum);
		    if (!IsZero(Norm)) {
                        Q->LeftKerCmp = (Real *)malloc((Dim + 1) * sizeof(Real));
		        if (Q->LeftKerCmp != NULL) {
		            for(Ind = 1; Ind <= Dim; Ind++)
	                        Q->LeftKerCmp[Ind] = KerCmp[Ind] / Norm;
		        } else {
	                    LASError(LASMemAllocErr, "Q_SetKer", Q->Name,
				RightKer->Name, LeftKer->Name);
		        }
	    	    }
	        }
	    } else {
	    }
	} else {
	    LASError(LASDimErr, "Q_SetKer", Q->Name, RightKer->Name, LeftKer->Name);
	}
    }

    V_Unlock(RightKer);
    V_Unlock(LeftKer);
}